

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.h
# Opt level: O3

void __thiscall
chrono::ChIntegrable::LoadResidual_F(ChIntegrable *this,ChVectorDynamic<> *R,double c)

{
  ChException *this_00;
  string local_40;
  
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "LoadResidual_F() not implemented, implicit integrators cannot be used. ","");
  ChException::ChException(this_00,&local_40);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

virtual void LoadResidual_F(ChVectorDynamic<>& R,  ///< result: the R residual, R += c*F
                                const double c         ///< a scaling factor
                                ) {
        throw ChException("LoadResidual_F() not implemented, implicit integrators cannot be used. ");
    }